

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void * xm_get_sample_waveform(xm_context_t *ctx,uint16_t i,uint16_t s,size_t *size,uint8_t *bits)

{
  xm_sample_t *pxVar1;
  undefined6 in_register_00000032;
  int iVar2;
  
  iVar2 = (int)CONCAT62(in_register_00000032,i);
  if ((iVar2 == 0) || ((ctx->module).num_instruments < i)) {
    xm_get_sample_waveform_cold_1();
  }
  if ((ctx->module).instruments[i].num_samples < s) {
    xm_get_sample_waveform_cold_2();
  }
  iVar2 = iVar2 + -1;
  pxVar1 = (ctx->module).instruments[iVar2].samples;
  *size = (ulong)pxVar1[s].length;
  *bits = pxVar1[s].bits;
  return (ctx->module).instruments[iVar2].samples[s].field_11.data8;
}

Assistant:

void* xm_get_sample_waveform(xm_context_t* ctx, uint16_t i, uint16_t s, size_t* size, uint8_t* bits) {
	CHECK_SAMPLE(ctx, i, s);
	*size = ctx->module.instruments[i - 1].samples[s].length;
	*bits = ctx->module.instruments[i - 1].samples[s].bits;
	return ctx->module.instruments[i - 1].samples[s].data8;
}